

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_errlog(jx9_context *pCtx,int argc,jx9_value **argv)

{
  long lVar1;
  
  lVar1 = *pCtx->pFunc->pUserData;
  jx9_value_string(pCtx->pRet,*(char **)(lVar1 + 0xc0),*(int *)(lVar1 + 200));
  return 0;
}

Assistant:

static int unqliteBuiltin_db_errlog(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_vm *pVm;
	SyBlob *pErr;
	
	SXUNUSED(argc); /* cc warning */
	SXUNUSED(argv);

	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Point to the error log */
	pErr = &pVm->pDb->sErr;
	/* Return the log */
	jx9_result_string(pCtx,(const char *)SyBlobData(pErr),(int)SyBlobLength(pErr));
	return JX9_OK;
}